

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_rect_pack.h
# Opt level: O0

int rect_height_compare(void *a,void *b)

{
  undefined4 local_34;
  stbrp_rect *q;
  stbrp_rect *p;
  void *b_local;
  void *a_local;
  
  if (*(ushort *)((long)b + 6) < *(ushort *)((long)a + 6)) {
    a_local._4_4_ = 0xffffffff;
  }
  else if (*(ushort *)((long)a + 6) < *(ushort *)((long)b + 6)) {
    a_local._4_4_ = 1;
  }
  else {
    if (*(ushort *)((long)b + 4) < *(ushort *)((long)a + 4)) {
      local_34 = 0xffffffff;
    }
    else {
      local_34 = (uint)(*(ushort *)((long)a + 4) < *(ushort *)((long)b + 4));
    }
    a_local._4_4_ = local_34;
  }
  return a_local._4_4_;
}

Assistant:

static int STBRP__CDECL rect_height_compare(const void *a, const void *b)
{
   const stbrp_rect *p = (const stbrp_rect *) a;
   const stbrp_rect *q = (const stbrp_rect *) b;
   if (p->h > q->h)
      return -1;
   if (p->h < q->h)
      return  1;
   return (p->w > q->w) ? -1 : (p->w < q->w);
}